

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O2

bool __thiscall jbcoin::STPathSet::assembleAdd(STPathSet *this,STPath *base,STPathElement *tail)

{
  vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *this_00;
  pointer this_01;
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  pointer pSVar4;
  
  this_00 = &this->value;
  std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::push_back(this_00,base);
  pSVar4 = (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl
           .super__Vector_impl_data._M_finish;
  this_01 = pSVar4 + -1;
  std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::push_back
            (&this_01->mPath,tail);
  pSVar4 = pSVar4 + -2;
  do {
    pSVar1 = pSVar4 + 1;
    pSVar2 = (this_00->super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar1 == pSVar2) goto LAB_001dd293;
    bVar3 = std::operator==(&pSVar4->mPath,&this_01->mPath);
    pSVar4 = pSVar4 + -1;
  } while (!bVar3);
  std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::pop_back(this_00);
LAB_001dd293:
  return pSVar1 == pSVar2;
}

Assistant:

bool
STPathSet::assembleAdd(STPath const& base, STPathElement const& tail)
{ // assemble base+tail and add it to the set if it's not a duplicate
    value.push_back (base);

    std::vector<STPath>::reverse_iterator it = value.rbegin ();

    STPath& newPath = *it;
    newPath.push_back (tail);

    while (++it != value.rend ())
    {
        if (*it == newPath)
        {
            value.pop_back ();
            return false;
        }
    }
    return true;
}